

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int local_4c;
  Limit local_48;
  int value;
  Limit limit;
  uint32 length;
  RepeatedField<int> *values_local;
  _func_bool_int *is_valid_local;
  CodedInputStream *input_local;
  int *piStack_20;
  uint32 temp;
  _func_bool_int *local_18;
  undefined1 local_9;
  
  _limit = values;
  values_local = (RepeatedField<int> *)is_valid;
  is_valid_local = (_func_bool_int *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
  if (bVar1) {
    local_48 = io::CodedInputStream::PushLimit((CodedInputStream *)is_valid_local,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)is_valid_local),
          0 < iVar2) {
      local_18 = is_valid_local;
      piStack_20 = &local_4c;
      local_9 = io::CodedInputStream::ReadVarint32
                          ((CodedInputStream *)is_valid_local,(uint32 *)((long)&input_local + 4));
      if (!(bool)local_9) {
        return false;
      }
      *piStack_20 = input_local._4_4_;
      uVar3 = (*(code *)values_local)(local_4c);
      if ((uVar3 & 1) != 0) {
        RepeatedField<int>::Add(_limit,&local_4c);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)is_valid_local,local_48);
    input_local._3_1_ = true;
  }
  else {
    input_local._3_1_ = false;
  }
  return input_local._3_1_;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}